

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *formatters,int numFormatters)

{
  _func_int *p_Var1;
  uint *puVar2;
  _func_int *p_Var3;
  _func_int **pp_Var4;
  int iVar5;
  FormatArg *pFVar6;
  code cVar7;
  long lVar8;
  char *pcVar9;
  bool spacePadPositive;
  int ntrunc;
  string result;
  ostringstream tmpStream;
  bool local_1f2;
  undefined1 local_1f1;
  int local_1f0;
  int local_1ec;
  undefined4 local_1e8;
  int local_1e4;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  undefined8 local_1c0;
  undefined8 local_1b8;
  FormatArg *local_1b0;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  p_Var3 = out->_vptr_basic_ostream[-3];
  p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)p_Var3);
  local_1b8 = *(undefined8 *)(&out->field_0x8 + (long)p_Var3);
  local_1c0 = *(undefined8 *)(&out->field_0x10 + (long)p_Var3);
  local_1e8 = *(undefined4 *)(&out->field_0x18 + (long)p_Var3);
  if ((&out->field_0xe1)[(long)p_Var3] == '\0') {
    cVar7 = (code)std::ios::widen((char)p_Var1);
    p_Var1[0xe0] = cVar7;
    p_Var1[0xe1] = (code)0x1;
  }
  local_1f1 = p_Var1[0xe0];
  local_1f0 = 0;
  pcVar9 = fmt;
  iVar5 = numFormatters;
  pFVar6 = formatters;
  if (0 < numFormatters) {
LAB_00124682:
    do {
      local_1b0 = pFVar6;
      local_1e4 = iVar5;
      if (*pcVar9 == '%') {
        std::ostream::write((char *)out,(long)fmt);
        if (pcVar9[1] == '%') {
          fmt = pcVar9 + 1;
          pcVar9 = fmt;
          goto LAB_001246c0;
        }
      }
      else {
        if (*pcVar9 != '\0') {
LAB_001246c0:
          pcVar9 = pcVar9 + 1;
          iVar5 = local_1e4;
          pFVar6 = local_1b0;
          goto LAB_00124682;
        }
        std::ostream::write((char *)out,(long)fmt);
      }
      local_1f2 = false;
      local_1ec = -1;
      fmt = streamStateFromFormat
                      (out,&local_1f2,&local_1ec,pcVar9,formatters,&local_1f0,numFormatters);
      lVar8 = (long)local_1f0;
      if (numFormatters <= local_1f0) {
        __assert_fail("0 && \"tinyformat: Not enough format arguments\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                      ,0x326,
                      "void tinyformat::detail::formatImpl(std::ostream &, const char *, const detail::FormatArg *, int)"
                     );
      }
      if (local_1f2 == false) {
        FormatArg::format(formatters + lVar8,out,pcVar9,fmt,local_1ec);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ios::copyfmt((ios *)((ostringstream *)local_1a8 + *(long *)(local_1a8[0] + -0x18)));
        puVar2 = (uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18));
        *puVar2 = *puVar2 | 0x800;
        FormatArg::format(formatters + lVar8,(ostream *)local_1a8,pcVar9,fmt,local_1ec);
        std::__cxx11::stringbuf::str();
        formatters = local_1b0;
        numFormatters = local_1e4;
        if (local_1d8 != 0) {
          lVar8 = 0;
          do {
            if (*(char *)((long)local_1e0 + lVar8) == '+') {
              *(undefined1 *)((long)local_1e0 + lVar8) = 0x20;
            }
            lVar8 = lVar8 + 1;
          } while (local_1d8 != lVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_1e0,local_1d8);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      local_1f0 = local_1f0 + 1;
      pcVar9 = fmt;
      iVar5 = local_1e4;
      pFVar6 = local_1b0;
    } while (local_1f0 < numFormatters);
  }
  do {
    if (*pcVar9 == '%') {
      std::ostream::write((char *)out,(long)fmt);
      if (pcVar9[1] != '%') goto LAB_00124875;
      fmt = pcVar9 + 1;
      pcVar9 = fmt;
    }
    else if (*pcVar9 == '\0') {
      std::ostream::write((char *)out,(long)fmt);
LAB_00124875:
      if (*pcVar9 != '\0') {
        __assert_fail("0 && \"tinyformat: Too many conversion specifiers in format string\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/ext/tinyformat/tinyformat.h"
                      ,0x342,
                      "void tinyformat::detail::formatImpl(std::ostream &, const char *, const detail::FormatArg *, int)"
                     );
      }
      pp_Var4 = out->_vptr_basic_ostream;
      *(undefined8 *)(&out->field_0x10 + (long)pp_Var4[-3]) = local_1c0;
      *(undefined8 *)(&out->field_0x8 + (long)pp_Var4[-3]) = local_1b8;
      *(undefined4 *)(&out->field_0x18 + (long)pp_Var4[-3]) = local_1e8;
      p_Var1 = (_func_int *)((long)&out->_vptr_basic_ostream + (long)pp_Var4[-3]);
      if ((&out->field_0xe1)[(long)pp_Var4[-3]] == '\0') {
        cVar7 = (code)std::ios::widen((char)p_Var1);
        p_Var1[0xe0] = cVar7;
        p_Var1[0xe1] = (code)0x1;
      }
      p_Var1[0xe0] = local_1f1;
      return;
    }
    pcVar9 = pcVar9 + 1;
  } while( true );
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* formatters,
                       int numFormatters)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    for (int argIndex = 0; argIndex < numFormatters; ++argIndex)
    {
        // Parse the format string
        fmt = printFormatStringLiteral(out, fmt);
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, spacePadPositive, ntrunc, fmt,
                                                   formatters, argIndex, numFormatters);
        if (argIndex >= numFormatters)
        {
            // Check args remain after reading any variable width/precision
            TINYFORMAT_ERROR("tinyformat: Not enough format arguments");
            return;
        }
        const FormatArg& arg = formatters[argIndex];
        // Format the arg into the stream.
        if(!spacePadPositive)
            arg.format(out, fmt, fmtEnd, ntrunc);
        else
        {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for(size_t i = 0, iend = result.size(); i < iend; ++i)
                if(result[i] == '+') result[i] = ' ';
            out << result;
        }
        fmt = fmtEnd;
    }

    // Print remaining part of format string.
    fmt = printFormatStringLiteral(out, fmt);
    if(*fmt != '\0')
        TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}